

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTree.cpp
# Opt level: O1

void __thiscall
RTree::distribute_polygons
          (RTree *this,RTree_node *node,RTree_node *brother,
          vector<d_leaf,_std::allocator<d_leaf>_> *data)

{
  RTree_node *pRVar1;
  RTree_node *pRVar2;
  RTree_node *pRVar3;
  int iVar4;
  int iVar5;
  RTree_node *pRVar6;
  pointer pdVar7;
  RTree_node **ppRVar8;
  Polygon *pPVar9;
  Polygon *pPVar10;
  RTree_node *pRVar11;
  RTree_node *pRVar12;
  RTree_node *pRVar13;
  long lVar14;
  ulong uVar15;
  d_leaf data_00;
  long local_48;
  long local_40;
  
  pRVar6 = (RTree_node *)(long)node->father->elements;
  if ((long)pRVar6 < 1) {
    local_40 = 0;
    local_48 = 0;
  }
  else {
    ppRVar8 = &((node->father->data_internal_node).
                super__Vector_base<d_internal_node,_std::allocator<d_internal_node>_>._M_impl.
                super__Vector_impl_data._M_start)->child;
    pRVar13 = (RTree_node *)0x0;
    pRVar11 = node;
    pRVar12 = (RTree_node *)this;
    do {
      pRVar1 = *ppRVar8;
      pRVar2 = pRVar12;
      if (pRVar1 == brother) {
        pRVar2 = pRVar13;
      }
      if (pRVar1 == node) {
        pRVar2 = pRVar12;
      }
      pRVar12 = (RTree_node *)((ulong)pRVar2 & 0xffffffff);
      pRVar3 = pRVar11;
      if (pRVar1 == node) {
        pRVar3 = pRVar13;
      }
      pRVar11 = (RTree_node *)((ulong)pRVar3 & 0xffffffff);
      pRVar13 = (RTree_node *)((long)&pRVar13->M + 1);
      ppRVar8 = ppRVar8 + 2;
    } while (pRVar6 != pRVar13);
    local_48 = (long)(int)pRVar3;
    local_40 = (long)(int)pRVar2;
  }
  pdVar7 = (data->super__Vector_base<d_leaf,_std::allocator<d_leaf>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((data->super__Vector_base<d_leaf,_std::allocator<d_leaf>_>)._M_impl.super__Vector_impl_data.
      _M_finish != pdVar7) {
    lVar14 = 8;
    uVar15 = 0;
    do {
      iVar4 = Polygon::cost_two_poligons
                        ((node->father->data_internal_node).
                         super__Vector_base<d_internal_node,_std::allocator<d_internal_node>_>.
                         _M_impl.super__Vector_impl_data._M_start[local_48].region,
                         *(Polygon **)((long)&pdVar7->polygon + lVar14));
      iVar5 = Polygon::cost_two_poligons
                        ((brother->father->data_internal_node).
                         super__Vector_base<d_internal_node,_std::allocator<d_internal_node>_>.
                         _M_impl.super__Vector_impl_data._M_start[local_40].region,
                         *(Polygon **)
                          ((long)&((data->super__Vector_base<d_leaf,_std::allocator<d_leaf>_>).
                                   _M_impl.super__Vector_impl_data._M_start)->polygon + lVar14));
      pRVar6 = node;
      if ((iVar4 < iVar5) && (node->elements <= this->M - this->m)) {
        pdVar7 = (data->super__Vector_base<d_leaf,_std::allocator<d_leaf>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pPVar10 = *(Polygon **)((long)pdVar7 + lVar14 + -8);
        pPVar9 = *(Polygon **)((long)&pdVar7->polygon + lVar14);
      }
      else {
        if ((iVar5 < iVar4) && (brother->elements <= this->M - this->m)) {
          pdVar7 = (data->super__Vector_base<d_leaf,_std::allocator<d_leaf>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          pPVar10 = *(Polygon **)((long)pdVar7 + lVar14 + -8);
          pPVar9 = *(Polygon **)((long)&pdVar7->polygon + lVar14);
        }
        else {
          pdVar7 = (data->super__Vector_base<d_leaf,_std::allocator<d_leaf>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          pPVar10 = *(Polygon **)((long)pdVar7 + lVar14 + -8);
          pPVar9 = *(Polygon **)((long)&pdVar7->polygon + lVar14);
          if (node->elements <= this->M - this->m) goto LAB_00105147;
        }
        pRVar6 = brother;
      }
LAB_00105147:
      data_00.region = pPVar9;
      data_00.polygon = pPVar10;
      insert_polygon(this,pRVar6,data_00);
      uVar15 = uVar15 + 1;
      pdVar7 = (data->super__Vector_base<d_leaf,_std::allocator<d_leaf>_>)._M_impl.
               super__Vector_impl_data._M_start;
      lVar14 = lVar14 + 0x10;
    } while (uVar15 < (ulong)((long)(data->super__Vector_base<d_leaf,_std::allocator<d_leaf>_>).
                                    _M_impl.super__Vector_impl_data._M_finish - (long)pdVar7 >> 4));
  }
  return;
}

Assistant:

void RTree::distribute_polygons(RTree_node * node, RTree_node * brother, const std::vector<d_leaf> & data){
    int i, j ;
    //Search where is the node & brother in the father.
    for(int a = 0; a < node->father->elements; a++){
        if(node->father->data_internal_node[a].child == node){
            i = a;
        }
        else if(node->father->data_internal_node[a].child == brother){
            j = a;
        }
    }
    for(int m = 0; m < data.size(); m++){
        int cost_node = node->father->data_internal_node[i].region->cost_two_poligons(*data[m].region);
        int cost_brother = brother->father->data_internal_node[j].region->cost_two_poligons(*data[m].region);
        if(cost_node < cost_brother && node->elements < this->M - this->m + 1){
            insert_polygon(node, data[m]);
        }
        else if(cost_node > cost_brother && brother->elements < this->M - this->m + 1){
            insert_polygon(brother, data[m]);
        }
        else{
            if(node->elements < this->M - this->m + 1){
                insert_polygon(node, data[m]);
            }
            else{
                insert_polygon(brother, data[m]);
            }
        }
    }
}